

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cc
# Opt level: O1

bool __thiscall flow::lang::Lexer::ipv6HexDigit4(Lexer *this)

{
  int iVar1;
  size_t sVar2;
  
  sVar2 = this->ipv6HexDigits_;
  iVar1 = isxdigit(this->currentChar_);
  if (iVar1 != 0) {
    do {
      std::__cxx11::string::push_back((char)this + -0x58);
      nextChar(this,true);
      sVar2 = sVar2 + 1;
      iVar1 = isxdigit(this->currentChar_);
    } while (iVar1 != 0);
  }
  this->ipv6HexDigits_ = 0;
  return sVar2 - 1 < 4;
}

Assistant:

bool Lexer::ipv6HexDigit4() {
  size_t i = ipv6HexDigits_;

  while (isHexChar()) {
    stringValue_ += static_cast<char>(currentChar());
    nextChar();
    ++i;
  }

  ipv6HexDigits_ = 0;

  return i >= 1 && i <= 4;
}